

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

int str_char(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  int narg;
  bool bVar4;
  luaL_Buffer b;
  luaL_Buffer local_2048;
  
  iVar2 = lua_gettop(L);
  luaL_buffinit(L,&local_2048);
  if (0 < iVar2) {
    narg = 1;
    do {
      uVar3 = luaL_checkinteger(L,narg);
      if ((uVar3 & 0xffffff00) != 0) {
        luaL_argerror(L,narg,"invalid value");
      }
      if (&stack0xffffffffffffffd0 <= local_2048.p) {
        luaL_prepbuffer(&local_2048);
      }
      pcVar1 = local_2048.p + 1;
      *local_2048.p = (char)uVar3;
      bVar4 = narg != iVar2;
      narg = narg + 1;
      local_2048.p = pcVar1;
    } while (bVar4);
  }
  luaL_pushresult(&local_2048);
  return 1;
}

Assistant:

static int str_char (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  for (i=1; i<=n; i++) {
    int c = luaL_checkint(L, i);
    luaL_argcheck(L, uchar(c) == c, i, "invalid value");
    luaL_addchar(&b, uchar(c));
  }
  luaL_pushresult(&b);
  return 1;
}